

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_3da::NinjaMain::DumpMetrics(NinjaMain *this)

{
  Metrics::Report(g_metrics);
  putchar(10);
  printf("path->node hash load %.2f (%d entries / %d buckets)\n",
         (double)(int)(this->state_).paths_._M_h._M_element_count /
         (double)(int)(this->state_).paths_._M_h._M_bucket_count);
  return;
}

Assistant:

void NinjaMain::DumpMetrics() {
  g_metrics->Report();

  printf("\n");
  int count = (int)state_.paths_.size();
  int buckets = (int)state_.paths_.bucket_count();
  printf("path->node hash load %.2f (%d entries / %d buckets)\n",
         count / (double) buckets, count, buckets);
}